

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.h
# Opt level: O2

void __thiscall nesvis::Gui::~Gui(Gui *this)

{
  MemoryWidget::~MemoryWidget(&this->memory_widget);
  std::array<sf::Texture,_512UL>::~array(&(this->ppu_widget).pattern_table_textures_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this);
  return;
}

Assistant:

Gui(n_e_s::nes::Nes *nes, PpuHelper *ppu_helper, Control *control)
            : log_widget(),
              cpu_widget(nes, control),
              ppu_widget(nes, ppu_helper),
              memory_widget(nes) {}